

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void setup_insn_data(gen_ctx_t gen_ctx,MIR_insn_t insn,bb_t_conflict bb)

{
  int iVar1;
  undefined8 *puVar2;
  insn_data_t insn_data;
  bb_t_conflict bb_local;
  MIR_insn_t insn_local;
  gen_ctx_t gen_ctx_local;
  
  iVar1 = insn_data_p(insn);
  if (iVar1 == 0) {
    insn->data = bb;
  }
  else {
    puVar2 = (undefined8 *)gen_malloc(gen_ctx,0x10);
    insn->data = puVar2;
    *puVar2 = bb;
    puVar2[1] = 0;
  }
  return;
}

Assistant:

static void setup_insn_data (gen_ctx_t gen_ctx, MIR_insn_t insn, bb_t bb) {
  insn_data_t insn_data;

  if (!insn_data_p (insn)) {
    insn->data = bb;
    return;
  }
  insn_data = insn->data = gen_malloc (gen_ctx, sizeof (struct insn_data));
  insn_data->bb = bb;
  insn_data->u.call_hard_reg_args = NULL;
}